

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_file.cc
# Opt level: O0

void __thiscall webrtc::WavReader::WavReader(WavReader *this,string *filename)

{
  bool bVar1;
  char *__filename;
  FILE *pFVar2;
  ostream *poVar3;
  FatalMessage local_650;
  string *local_4d8;
  string *_result_1;
  string *local_358;
  string *_result;
  FatalMessage local_348;
  FatalMessageVoidify local_1c9;
  size_t local_1c8;
  size_t bytes_per_sample;
  undefined1 local_1b8 [4];
  WavFormat format;
  ReadableWavFile readable;
  FatalMessage local_1a0;
  FatalMessageVoidify local_25 [13];
  string *local_18;
  string *filename_local;
  WavReader *this_local;
  
  local_18 = filename;
  filename_local = (string *)this;
  WavFile::WavFile(&this->super_WavFile);
  (this->super_WavFile)._vptr_WavFile = (_func_int **)&PTR__WavReader_002fb8f8;
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar2 = fopen(__filename,"rb");
  this->file_handle_ = (FILE *)pFVar2;
  readable.file_._7_1_ = 0;
  if (this->file_handle_ == (FILE *)0x0) {
    rtc::FatalMessageVoidify::FatalMessageVoidify(local_25);
    rtc::FatalMessage::FatalMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
               ,0x33);
    readable.file_._7_1_ = 1;
    poVar3 = rtc::FatalMessage::stream(&local_1a0);
    poVar3 = std::operator<<(poVar3,"Check failed: file_handle_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"# ");
    poVar3 = std::operator<<(poVar3,"Could not open wav file for reading.");
    rtc::FatalMessageVoidify::operator&(local_25,poVar3);
  }
  if ((readable.file_._7_1_ & 1) != 0) {
    rtc::FatalMessage::~FatalMessage(&local_1a0);
  }
  ReadableWavFile::ReadableWavFile((ReadableWavFile *)local_1b8,this->file_handle_);
  _result._7_1_ = 0;
  bVar1 = ReadWavHeader((ReadableWav *)local_1b8,&this->num_channels_,&this->sample_rate_,
                        (WavFormat *)((long)&bytes_per_sample + 4),&local_1c8,&this->num_samples_);
  if (!bVar1) {
    rtc::FatalMessageVoidify::FatalMessageVoidify(&local_1c9);
    rtc::FatalMessage::FatalMessage
              (&local_348,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
               ,0x39);
    _result._7_1_ = 1;
    poVar3 = rtc::FatalMessage::stream(&local_348);
    poVar3 = std::operator<<(poVar3,
                             "Check failed: ReadWavHeader(&readable, &num_channels_, &sample_rate_, &format, &bytes_per_sample, &num_samples_)"
                            );
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"# ");
    rtc::FatalMessageVoidify::operator&(&local_1c9,poVar3);
  }
  if ((_result._7_1_ & 1) != 0) {
    rtc::FatalMessage::~FatalMessage(&local_348);
  }
  this->num_samples_remaining_ = this->num_samples_;
  local_358 = rtc::CheckEQImpl<webrtc::WavFormat,webrtc::WavFormat>
                        (&kWavFormat,(WavFormat *)((long)&bytes_per_sample + 4),
                         "kWavFormat == format");
  if (local_358 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)&_result_1,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
               ,0x3b,local_358);
    rtc::FatalMessage::stream((FatalMessage *)&_result_1);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)&_result_1);
  }
  local_4d8 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                        (&kBytesPerSample,&local_1c8,"kBytesPerSample == bytes_per_sample");
  if (local_4d8 == (string *)0x0) {
    ReadableWavFile::~ReadableWavFile((ReadableWavFile *)local_1b8);
    return;
  }
  rtc::FatalMessage::FatalMessage
            (&local_650,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
             ,0x3c,local_4d8);
  rtc::FatalMessage::stream(&local_650);
  rtc::FatalMessage::~FatalMessage(&local_650);
}

Assistant:

WavReader::WavReader(const std::string& filename)
    : file_handle_(fopen(filename.c_str(), "rb")) {
  RTC_CHECK(file_handle_) << "Could not open wav file for reading.";

  ReadableWavFile readable(file_handle_);
  WavFormat format;
  size_t bytes_per_sample;
  RTC_CHECK(ReadWavHeader(&readable, &num_channels_, &sample_rate_, &format,
                          &bytes_per_sample, &num_samples_));
  num_samples_remaining_ = num_samples_;
  RTC_CHECK_EQ(kWavFormat, format);
  RTC_CHECK_EQ(kBytesPerSample, bytes_per_sample);
}